

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::RenderPassCreateInfo::addAttachment
          (RenderPassCreateInfo *this,VkAttachmentDescription attachment)

{
  pointer *ppAVar1;
  iterator __position;
  pointer pVVar2;
  void *pvVar3;
  allocator_type local_39;
  AttachmentDescription local_38;
  
  local_38.super_VkAttachmentDescription.flags = attachment.flags;
  local_38.super_VkAttachmentDescription.format = attachment.format;
  local_38.super_VkAttachmentDescription.samples = attachment.samples;
  local_38.super_VkAttachmentDescription.loadOp = attachment.loadOp;
  local_38.super_VkAttachmentDescription.storeOp = attachment.storeOp;
  local_38.super_VkAttachmentDescription.stencilLoadOp = attachment.stencilLoadOp;
  local_38.super_VkAttachmentDescription.stencilStoreOp = attachment.stencilStoreOp;
  local_38.super_VkAttachmentDescription.initialLayout = attachment.initialLayout;
  local_38.super_VkAttachmentDescription.finalLayout = attachment.finalLayout;
  __position._M_current =
       (this->m_attachments).
       super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_attachments).
      super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
    ::_M_realloc_insert<vkt::Draw::AttachmentDescription>(&this->m_attachments,__position,&local_38)
    ;
  }
  else {
    ((__position._M_current)->super_VkAttachmentDescription).finalLayout =
         local_38.super_VkAttachmentDescription.finalLayout;
    ((__position._M_current)->super_VkAttachmentDescription).storeOp = (int)attachment._16_8_;
    ((__position._M_current)->super_VkAttachmentDescription).stencilLoadOp =
         (int)((ulong)attachment._16_8_ >> 0x20);
    ((__position._M_current)->super_VkAttachmentDescription).stencilStoreOp = (int)attachment._24_8_
    ;
    ((__position._M_current)->super_VkAttachmentDescription).initialLayout =
         (int)((ulong)attachment._24_8_ >> 0x20);
    ((__position._M_current)->super_VkAttachmentDescription).flags = (int)attachment._0_8_;
    ((__position._M_current)->super_VkAttachmentDescription).format =
         (int)((ulong)attachment._0_8_ >> 0x20);
    ((__position._M_current)->super_VkAttachmentDescription).samples = (int)attachment._8_8_;
    ((__position._M_current)->super_VkAttachmentDescription).loadOp =
         (int)((ulong)attachment._8_8_ >> 0x20);
    ppAVar1 = &(this->m_attachments).
               super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &local_38,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_39);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  _M_move_assign(&this->m_attachmentsStructs,
                 (vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
                 &local_38);
  pvVar3 = (void *)CONCAT44(local_38.super_VkAttachmentDescription.format,
                            local_38.super_VkAttachmentDescription.flags);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,CONCAT44(local_38.super_VkAttachmentDescription.stencilLoadOp,
                                    local_38.super_VkAttachmentDescription.storeOp) - (long)pvVar3);
  }
  pVVar2 = (this->m_attachmentsStructs).
           super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkRenderPassCreateInfo).attachmentCount =
       (int)((ulong)((long)(this->m_attachments).
                           super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_attachments).
                          super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39;
  (this->super_VkRenderPassCreateInfo).pAttachments = pVVar2;
  return;
}

Assistant:

void
RenderPassCreateInfo::addAttachment (vk::VkAttachmentDescription attachment)
{

	m_attachments.push_back(attachment);
	m_attachmentsStructs	= std::vector<vk::VkAttachmentDescription>(m_attachments.begin(), m_attachments.end());
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachmentsStructs[0];
}